

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

bool __thiscall
spirv_cross::CompilerGLSL::subpass_input_is_framebuffer_fetch(CompilerGLSL *this,uint32_t id)

{
  bool bVar1;
  reference ppVar2;
  pair<unsigned_int,_unsigned_int> *remap;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *__range1;
  ID local_20;
  uint32_t input_attachment_index;
  CompilerGLSL *pCStack_18;
  uint32_t id_local;
  CompilerGLSL *this_local;
  
  input_attachment_index = id;
  pCStack_18 = this;
  TypedID<(spirv_cross::Types)0>::TypedID(&local_20,id);
  bVar1 = Compiler::has_decoration(&this->super_Compiler,local_20,DecorationInputAttachmentIndex);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    TypedID<(spirv_cross::Types)0>::TypedID
              ((TypedID<(spirv_cross::Types)0> *)&__range1,input_attachment_index);
    __range1._4_4_ =
         Compiler::get_decoration
                   (&this->super_Compiler,__range1._0_4_,DecorationInputAttachmentIndex);
    __end1 = ::std::
             vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             ::begin(&this->subpass_to_framebuffer_fetch_attachment);
    remap = (pair<unsigned_int,_unsigned_int> *)
            ::std::
            vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ::end(&this->subpass_to_framebuffer_fetch_attachment);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
                                       *)&remap), bVar1) {
      ppVar2 = __gnu_cxx::
               __normal_iterator<const_std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
               ::operator*(&__end1);
      if (ppVar2->first == __range1._4_4_) {
        return true;
      }
      __gnu_cxx::
      __normal_iterator<const_std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
      ::operator++(&__end1);
    }
  }
  return false;
}

Assistant:

bool CompilerGLSL::subpass_input_is_framebuffer_fetch(uint32_t id) const
{
	if (!has_decoration(id, DecorationInputAttachmentIndex))
		return false;

	uint32_t input_attachment_index = get_decoration(id, DecorationInputAttachmentIndex);
	for (auto &remap : subpass_to_framebuffer_fetch_attachment)
		if (remap.first == input_attachment_index)
			return true;

	return false;
}